

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

extent_hooks_t *
duckdb_je_arena_set_extent_hooks(tsd_t *tsd,arena_t *arena,extent_hooks_t *extent_hooks)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  background_thread_info_t *pbVar3;
  background_thread_info_t *pbVar4;
  int iVar5;
  extent_hooks_t *peVar6;
  ulong uVar7;
  pthread_mutex_t *__mutex;
  mutex_prof_data_t *data;
  
  pbVar4 = duckdb_je_background_thread_info;
  uVar7 = (ulong)arena->ind % duckdb_je_max_background_threads;
  pbVar3 = duckdb_je_background_thread_info + uVar7;
  __mutex = (pthread_mutex_t *)((long)&duckdb_je_background_thread_info[uVar7].mtx.field_0 + 0x48);
  iVar5 = pthread_mutex_trylock(__mutex);
  if (iVar5 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&pbVar3->mtx);
    pbVar4[uVar7].mtx.field_0.field_0.locked.repr = true;
  }
  puVar1 = &pbVar4[uVar7].mtx.field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if (&(pbVar4[uVar7].mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    pbVar4[uVar7].mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
    ppwVar2 = &pbVar4[uVar7].mtx.field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  duckdb_je_pa_shard_disable_hpa((tsdn_t *)tsd,&arena->pa_shard);
  peVar6 = duckdb_je_base_extent_hooks_set(arena->base,extent_hooks);
  pbVar4[uVar7].mtx.field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return peVar6;
}

Assistant:

extent_hooks_t *
arena_set_extent_hooks(tsd_t *tsd, arena_t *arena,
    extent_hooks_t *extent_hooks) {
	background_thread_info_t *info;
	if (have_background_thread) {
		info = arena_background_thread_info_get(arena);
		malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
	}
	/* No using the HPA now that we have the custom hooks. */
	pa_shard_disable_hpa(tsd_tsdn(tsd), &arena->pa_shard);
	extent_hooks_t *ret = base_extent_hooks_set(arena->base, extent_hooks);
	if (have_background_thread) {
		malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
	}

	return ret;
}